

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

void __thiscall lodepng::ExtractPNG::decode(ExtractPNG *this,uchar *in,size_t size)

{
  bool bVar1;
  int iVar2;
  pointer *ppuVar3;
  pointer in_RDX;
  pointer in_RSI;
  ExtractPNG *in_RDI;
  ExtractZlib zlib;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  size_t chunkLength;
  bool IEND;
  vector<unsigned_char,_std::allocator<unsigned_char>_> idat;
  size_t pos;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  ExtractZlib *in_stack_ffffffffffffff00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  ExtractZlib *in_stack_ffffffffffffff28;
  uchar *in_stack_ffffffffffffff30;
  uchar *in_stack_ffffffffffffff38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  pointer *local_20;
  pointer local_18;
  pointer local_10;
  
  in_RDI->error = 0;
  if ((in_RDX == (pointer)0x0) || (in_RSI == (pointer)0x0)) {
    in_RDI->error = 0x30;
  }
  else {
    local_18 = in_RDX;
    local_10 = in_RSI;
    readPngHeader(in_RDI,(uchar *)in_RSI,(size_t)in_RDX);
    if (in_RDI->error == 0) {
      local_20 = (pointer *)0x21;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x145ead);
      bVar1 = false;
      while (!bVar1) {
        if (local_18 <= local_20 + 1) {
          in_RDI->error = 0x1e;
          goto LAB_0014623d;
        }
        in_stack_ffffffffffffff10 =
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             read32bitInt(in_RDI,(uchar *)((long)local_10 + (long)local_20));
        ppuVar3 = (pointer *)((long)local_20 + 4);
        if ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x7fffffff <
            in_stack_ffffffffffffff10) {
          in_RDI->error = 0x3f;
          local_20 = ppuVar3;
          goto LAB_0014623d;
        }
        if (local_18 <= (pointer)((long)ppuVar3 + (long)in_stack_ffffffffffffff10)) {
          in_RDI->error = 0x23;
          local_20 = ppuVar3;
          goto LAB_0014623d;
        }
        if ((((*(uchar *)((long)local_10 + (long)ppuVar3) == 'I') &&
             (((uchar *)((long)local_10 + 1))[(long)ppuVar3] == 'D')) &&
            (((uchar *)((long)local_10 + 2))[(long)ppuVar3] == 'A')) &&
           (((uchar *)((long)local_10 + 3))[(long)ppuVar3] == 'T')) {
          in_stack_ffffffffffffff00 = (ExtractZlib *)&stack0xffffffffffffffc8;
          pvVar4 = in_stack_ffffffffffffff10;
          local_20 = ppuVar3;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_ffffffffffffff00,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<unsigned_char_const*,void>
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30);
          local_20 = (pointer *)
                     ((undefined1 *)
                      ((long)&(in_stack_ffffffffffffff10->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start + 4) + (long)local_20);
          in_stack_ffffffffffffff10 = pvVar4;
        }
        else if (((*(uchar *)((long)local_10 + (long)ppuVar3) == 'I') &&
                 (((uchar *)((long)local_10 + 1))[(long)ppuVar3] == 'E')) &&
                ((((uchar *)((long)local_10 + 2))[(long)ppuVar3] == 'N' &&
                 (((uchar *)((long)local_10 + 3))[(long)ppuVar3] == 'D')))) {
          local_20 = local_20 + 1;
          bVar1 = true;
        }
        else {
          local_20 = (pointer *)
                     ((undefined1 *)
                      ((long)&(in_stack_ffffffffffffff10->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start + 4) + (long)ppuVar3);
        }
        local_20 = (pointer *)((long)local_20 + 4);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x146192);
      ExtractZlib::ExtractZlib
                (in_stack_ffffffffffffff00,
                 (vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      iVar2 = ExtractZlib::decompress
                        (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
      in_RDI->error = iVar2;
      ExtractZlib::~ExtractZlib(in_stack_ffffffffffffff00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff10)
      ;
LAB_0014623d:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff10)
      ;
    }
  }
  return;
}

Assistant:

void decode(const unsigned char* in, size_t size) {
    error = 0;
    if(size == 0 || in == 0) { error = 48; return; } //the given data is empty
    readPngHeader(&in[0], size); if(error) return;
    size_t pos = 33; //first byte of the first chunk after the header
    std::vector<unsigned char> idat; //the data from idat chunks
    bool IEND = false;
    //loop through the chunks, ignoring unknown chunks and stopping at IEND chunk.
    //IDAT data is put at the start of the in buffer
    while(!IEND) {
      //error: size of the in buffer too small to contain next chunk
      if(pos + 8 >= size) { error = 30; return; }
      size_t chunkLength = read32bitInt(&in[pos]); pos += 4;
      if(chunkLength > 2147483647) { error = 63; return; }
      //error: size of the in buffer too small to contain next chunk
      if(pos + chunkLength >= size) { error = 35; return; }
      //IDAT chunk, containing compressed image data
      if(in[pos + 0] == 'I' && in[pos + 1] == 'D' && in[pos + 2] == 'A' && in[pos + 3] == 'T') {
        idat.insert(idat.end(), &in[pos + 4], &in[pos + 4 + chunkLength]);
        pos += (4 + chunkLength);
      } else if(in[pos + 0] == 'I' && in[pos + 1] == 'E' && in[pos + 2] == 'N' && in[pos + 3] == 'D') {
          pos += 4;
          IEND = true;
      } else { //it's not an implemented chunk type, so ignore it: skip over the data
        pos += (chunkLength + 4); //skip 4 letters and uninterpreted data of unimplemented chunk
      }
      pos += 4; //step over CRC (which is ignored)
    }
    std::vector<unsigned char> out; //now the out buffer will be filled
    ExtractZlib zlib(zlibinfo); //decompress with the Zlib decompressor
    error = zlib.decompress(out, idat);
    if(error) return; //stop if the zlib decompressor returned an error
  }